

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2SharingRandomTest::GLES2SharingRandomTest
          (GLES2SharingRandomTest *this,EglTestContext *context,TestConfig *config,char *name,
          char *description)

{
  deUint32 dVar1;
  TestLog *pTVar2;
  char *description_local;
  char *name_local;
  TestConfig *config_local;
  EglTestContext *context_local;
  GLES2SharingRandomTest *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GLES2SharingRandomTest_006704e0;
  memcpy(&this->m_config,config,0x90c);
  dVar1 = deStringHash(name);
  this->m_seed = dVar1;
  dVar1 = deStringHash(name);
  de::Random::Random(&this->m_random,dVar1);
  pTVar2 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  this->m_log = pTVar2;
  this->m_threadsStarted = false;
  this->m_threadsRunning = false;
  this->m_executionReady = false;
  this->m_requiresRestart = false;
  this->m_beginTimeUs = 0;
  this->m_timeOutUs = 10000000;
  this->m_sleepTimeMs = 1;
  this->m_timeOutTimeUs = 0;
  std::
  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
  ::vector(&this->m_threads);
  this->m_eglDisplay = (EGLDisplay)0x0;
  this->m_eglConfig = (EGLConfig)0x0;
  this->m_lastOperation = THREADOPERATIONID_NONE;
  glw::Functions::Functions(&this->m_gl);
  return;
}

Assistant:

GLES2SharingRandomTest::GLES2SharingRandomTest (EglTestContext& context, const TestConfig& config, const char* name, const char* description)
	: TestCase			(context, name, description)
	, m_config			(config)
	, m_seed			(deStringHash(name))
	, m_random			(deStringHash(name))
	, m_log				(m_testCtx.getLog())
	, m_threadsStarted	(false)
	, m_threadsRunning	(false)
	, m_executionReady	(false)
	, m_requiresRestart	(false)
	, m_beginTimeUs		(0)
	, m_timeOutUs		(10000000)	// 10 seconds
	, m_sleepTimeMs		(1)		// 1 milliseconds
	, m_timeOutTimeUs	(0)
	, m_eglDisplay		(EGL_NO_DISPLAY)
	, m_eglConfig		(0)
	, m_lastOperation	(THREADOPERATIONID_NONE)
{
}